

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::
BindingPointCheck<glcts::(anonymous_namespace)::test_api::GL>
          (DrawIndirectBase *this,GLuint expectedValue)

{
  GLboolean value;
  GLboolean value_00;
  CallLogWrapper *this_00;
  char (*pacVar1) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  char *this_01;
  GLboolean valueBool;
  GLint valueInt;
  GLfloat valueFloat;
  GLdouble valueDouble;
  DIResult status;
  byte local_371;
  GLuint local_370;
  GLuint local_36c;
  float local_368 [8];
  string local_348;
  DILogger local_328;
  DIResult local_1a8;
  
  local_370 = expectedValue;
  DIResult::DIResult(&local_1a8);
  local_36c = 0xffffd8f1;
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8f43,(GLint *)&local_36c);
  if (local_36c != expectedValue) {
    DIResult::error(&local_328,&local_1a8);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_328,
               (char (*) [72])
               "glGetIntegerv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ");
    pacVar1 = (char (*) [13])&local_36c;
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_328,(int *)pacVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_328,pacVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_328,&local_370);
    DILogger::~DILogger(&local_328);
  }
  local_371 = expectedValue == 0;
  glu::CallLogWrapper::glGetBooleanv(this_00,0x8f43,&local_371);
  if ((bool)local_371 != (expectedValue != 0)) {
    DIResult::error(&local_328,&local_1a8);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_328,
               (char (*) [72])
               "glGetBooleanv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ");
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_348,(DrawIndirectBase *)(ulong)local_371,value);
    t = &local_348;
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_328,t);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_328,(char (*) [13])t);
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              ((string *)local_368,(DrawIndirectBase *)(ulong)(expectedValue != 0),value_00);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_328,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368);
    std::__cxx11::string::~string((string *)local_368);
    std::__cxx11::string::~string((string *)&local_348);
    DILogger::~DILogger(&local_328);
  }
  local_368[0] = -9999.0;
  glu::CallLogWrapper::glGetFloatv(this_00,0x8f43,local_368);
  if ((local_368[0] != (float)expectedValue) || (NAN(local_368[0]) || NAN((float)expectedValue))) {
    DIResult::error(&local_328,&local_1a8);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_328,
               (char (*) [70])
               "glGetFloatv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ");
    pacVar1 = (char (*) [13])local_368;
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_328,(float *)pacVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_328,pacVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_328,&local_370);
    DILogger::~DILogger(&local_328);
  }
  local_348._M_dataplus._M_p = (pointer)0xc0c3878000000000;
  glu::CallLogWrapper::glGetDoublev(this_00,0x8f43,(GLdouble *)&local_348);
  if (((double)local_348._M_dataplus._M_p != (double)expectedValue) ||
     (NAN((double)local_348._M_dataplus._M_p) || NAN((double)expectedValue))) {
    this_01 = (char *)&local_1a8;
    DIResult::error(&local_328,(DIResult *)this_01);
    if (local_328.null_log_ == false) {
      this_01 = "glGetDoublev(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ";
      std::operator<<(&local_328.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                      "glGetDoublev(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ");
    }
    if ((local_328.null_log_ & 1U) == 0) {
      std::ostream::_M_insert<double>((double)local_348._M_dataplus._M_p);
    }
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_328,(char (*) [13])this_01);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_328,&local_370);
    DILogger::~DILogger(&local_328);
  }
  DILogger::~DILogger(&local_1a8.logger_);
  return local_1a8.status_;
}

Assistant:

long BindingPointCheck(GLuint expectedValue)
	{
		DIResult status;

		GLint valueInt = -9999;
		glGetIntegerv(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueInt);
		if (valueInt != static_cast<GLint>(expectedValue))
		{
			status.error() << "glGetIntegerv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: " << valueInt
						   << ", expected: " << expectedValue;
		}

		GLboolean valueBool = expectedValue ? GL_FALSE : GL_TRUE;
		glGetBooleanv(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueBool);
		if (valueBool != (expectedValue ? GL_TRUE : GL_FALSE))
		{
			status.error() << "glGetBooleanv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: "
						   << BoolToString(valueBool)
						   << ", expected: " << BoolToString(expectedValue ? GL_TRUE : GL_FALSE);
		}

		GLfloat valueFloat		   = -9999;
		GLfloat expectedFloatValue = static_cast<GLfloat>(expectedValue);
		glGetFloatv(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueFloat);
		if (valueFloat != expectedFloatValue)
		{
			status.error() << "glGetFloatv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: " << valueFloat
						   << ", expected: " << expectedValue;
		}

		if (!api::isES())
		{
			GLdouble valueDouble = -9999;
			glGetDoublev(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueDouble);
			if (valueDouble != static_cast<GLdouble>(expectedValue))
			{
				status.error() << "glGetDoublev(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: "
							   << valueDouble << ", expected: " << expectedValue;
			}
		}

		return status.code();
	}